

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O2

rk_s32 kmpp_obj_udump_f(KmppObj obj,char *caller)

{
  MppTrieInfo *__haystack;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  MppTrieInfo *pMVar5;
  char *pcVar6;
  undefined8 *val_00;
  undefined8 *val_01;
  void *val_02;
  KmppEntry *pKVar7;
  void *__s2;
  uint uVar8;
  MppTrieInfo *info;
  MppTrie trie;
  ulong uVar9;
  int local_114;
  ulong local_110;
  rk_s32 val_chk;
  undefined4 uStack_104;
  MppTrieInfo *local_100;
  uint local_f4;
  MppTrieInfo *local_f0;
  KmppObj local_e8;
  KmppEntry *local_e0;
  void *local_d8;
  MppTrie local_d0;
  long local_c8;
  ulong local_c0;
  rk_s32 val;
  undefined4 uStack_b4;
  
  if ((obj == (KmppObj)0x0) || (*(long *)((long)obj + 8) == 0)) {
    _mpp_log_l(2,"kmpp_obj","invalid obj %p def %p\n","kmpp_obj_udump_f",obj,0);
    iVar3 = -1;
  }
  else {
    trie = *(MppTrie *)((long)obj + 0x10);
    _mpp_log_l(4,"kmpp_obj","dump obj %-12s - %p at %s:\n",(char *)0x0,
               *(undefined8 *)(*(long *)((long)obj + 8) + 0x18),obj,caller);
    pMVar5 = mpp_trie_get_info_first(trie);
    local_114 = -1;
    local_110 = 0;
    local_e8 = obj;
    local_d0 = trie;
LAB_00165044:
    info = pMVar5;
    if (info != (MppTrieInfo *)0x0) {
      pMVar5 = mpp_trie_get_info_next(trie,info);
      __haystack = info + 1;
      bVar1 = info->field_0x3;
      pcVar6 = strstr((char *)__haystack,"__");
      if (pcVar6 == (char *)0x0) {
        pKVar7 = (KmppEntry *)(&info[1].field_0x0 + bVar1);
        uVar8 = (int)local_110 + 1;
        local_100 = pMVar5;
        switch((ulong)(*(ushort *)pKVar7 >> 8)) {
        case 0:
          local_114 = kmpp_obj_tbl_get_s32(obj,pKVar7,&val);
          if (local_114 == 0) {
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s s32 %#x:%d\n",(char *)0x0,local_110,__haystack,
                       (ulong)(uint)val,(ulong)(uint)val);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s32 get failed\n",(char *)0x0,local_110,__haystack
                      );
          }
          kmpp_obj_get_s32(obj,(char *)__haystack,&val_chk);
          if (val != val_chk) {
            pcVar6 = "%-2d - %-16s s32 check failed\n";
LAB_001656be:
            _mpp_log_l(2,"kmpp_obj",pcVar6,(char *)0x0,local_110,__haystack);
          }
          break;
        case 1:
          local_114 = kmpp_obj_tbl_get_u32(obj,pKVar7,(rk_u32 *)&val);
          if (local_114 == 0) {
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s u32 %#x:%u\n",(char *)0x0,local_110,__haystack,
                       (ulong)(uint)val,(ulong)(uint)val);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u32 get failed\n",(char *)0x0,local_110,__haystack
                      );
          }
          kmpp_obj_get_u32(obj,(char *)__haystack,(rk_u32 *)&val_chk);
          if (val != val_chk) {
            pcVar6 = "%-2d - %-16s u32 check failed\n";
            goto LAB_001656be;
          }
          break;
        case 2:
          local_114 = kmpp_obj_tbl_get_s64(obj,pKVar7,(rk_s64 *)&val);
          if (local_114 == 0) {
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s s64 %#llx:%lld\n",(char *)0x0,local_110,__haystack
                       ,CONCAT44(uStack_b4,val),CONCAT44(uStack_b4,val));
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s64 get failed\n",(char *)0x0,local_110,__haystack
                      );
          }
          kmpp_obj_get_s64(obj,(char *)__haystack,(rk_s64 *)&val_chk);
          if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_104,val_chk)) {
            pcVar6 = "%-2d - %-16s s64 check failed\n";
            goto LAB_001656be;
          }
          break;
        case 3:
          local_114 = kmpp_obj_tbl_get_u64(obj,pKVar7,(rk_u64 *)&val);
          if (local_114 == 0) {
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s u64 %#llx:%llu\n",(char *)0x0,local_110,__haystack
                       ,CONCAT44(uStack_b4,val),CONCAT44(uStack_b4,val));
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u64 get failed\n",(char *)0x0,local_110,__haystack
                      );
          }
          kmpp_obj_get_u64(obj,(char *)__haystack,(rk_u64 *)&val_chk);
          if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_104,val_chk)) {
            pcVar6 = "%-2d - %-16s u64 check failed\n";
            goto LAB_001656be;
          }
          break;
        default:
          _mpp_log_l(2,"kmpp_obj","%-2d - %-16s found invalid type %d\n",(char *)0x0,local_110,
                     __haystack,(ulong)(*(ushort *)pKVar7 >> 8));
          local_114 = -1;
          break;
        case 5:
          local_f0 = __haystack;
          local_e0 = pKVar7;
          local_d8 = mpp_osal_malloc("kmpp_obj_udump_f",
                                     (ulong)*(ushort *)(&info[1].field_0x2 + bVar1));
          pKVar7 = local_e0;
          val_02 = mpp_osal_malloc("kmpp_obj_udump_f",(ulong)*(ushort *)((long)local_e0 + 2));
          uVar2 = *(ushort *)((long)pKVar7 + 2);
          local_114 = kmpp_obj_tbl_get_st(obj,pKVar7,val_02);
          pMVar5 = local_f0;
          if (local_114 == 0) {
            local_f4 = uVar8;
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s st  %d:%d\n",(char *)0x0,local_110,local_f0,
                       (ulong)*(ushort *)((long)pKVar7 + 4),(ulong)uVar2);
            uVar8 = (uint)(uVar2 >> 2);
            local_c0 = (ulong)uVar8;
            local_c8 = (long)(int)(uVar8 - 8);
            for (uVar9 = 0; (long)uVar9 < local_c8; uVar9 = uVar9 + 8) {
              snprintf((char *)&val,0x7f,
                       "   - %02x : %#08x %#08x %#08x %#08x %#08x %#08x %#08x %#08x",
                       uVar9 & 0xffffffff,(ulong)*(uint *)((long)val_02 + uVar9 * 4),
                       (ulong)*(uint *)((long)val_02 + uVar9 * 4 + 4),
                       (ulong)*(uint *)((long)val_02 + uVar9 * 4 + 8),
                       (ulong)*(uint *)((long)val_02 + uVar9 * 4 + 0xc),
                       (ulong)*(uint *)((long)val_02 + uVar9 * 4 + 0x10),
                       (ulong)*(uint *)((long)val_02 + uVar9 * 4 + 0x14),
                       (ulong)*(uint *)((long)val_02 + uVar9 * 4 + 0x18),
                       (ulong)*(uint *)((long)val_02 + uVar9 * 4 + 0x1c));
              _mpp_log_l(4,"kmpp_obj","%s\n",(char *)0x0,&val);
            }
            iVar3 = snprintf((char *)&val,0x7f,"   - %02x :");
            uVar8 = local_f4;
            for (; uVar9 < local_c0; uVar9 = uVar9 + 1) {
              iVar4 = snprintf((char *)((long)&val + (long)iVar3),0x7f - (long)iVar3," %#08x");
              iVar3 = iVar3 + iVar4;
            }
            _mpp_log_l(4,"kmpp_obj","%s\n",(char *)0x0,&val);
            obj = local_e8;
            pMVar5 = local_f0;
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s st  get failed\n",(char *)0x0,local_110,local_f0);
          }
          __s2 = local_d8;
          kmpp_obj_get_st(obj,(char *)pMVar5,local_d8);
          iVar3 = bcmp(val_02,__s2,(ulong)*(ushort *)((long)local_e0 + 2));
          if (iVar3 != 0) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s st  check failed\n",(char *)0x0,local_110,pMVar5);
            _mpp_log_l(2,"kmpp_obj","val     %p\n",(char *)0x0,val_02);
            __s2 = local_d8;
            _mpp_log_l(2,"kmpp_obj","val_chk %p\n",(char *)0x0,local_d8);
          }
          trie = local_d0;
          if (val_02 != (void *)0x0) {
            mpp_osal_free("kmpp_obj_udump_f",val_02);
          }
          obj = local_e8;
          if (__s2 != (void *)0x0) {
            mpp_osal_free("kmpp_obj_udump_f",__s2);
          }
          break;
        case 6:
          local_f0 = __haystack;
          val_00 = (undefined8 *)
                   mpp_osal_malloc("kmpp_obj_udump_f",(ulong)*(ushort *)(&info[1].field_0x2 + bVar1)
                                  );
          val_01 = (undefined8 *)
                   mpp_osal_malloc("kmpp_obj_udump_f",(ulong)*(ushort *)(&info[1].field_0x2 + bVar1)
                                  );
          local_114 = kmpp_obj_tbl_get_st(obj,pKVar7,val_01);
          pMVar5 = local_f0;
          if (local_114 == 0) {
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s shm u%#llx:k%#llx\n",(char *)0x0,local_110,
                       local_f0,*val_01,val_01[1]);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s shm get failed\n",(char *)0x0,local_110,local_f0);
          }
          kmpp_obj_get_st(local_e8,(char *)pMVar5,val_00);
          iVar3 = bcmp(val_01,val_00,(ulong)*(ushort *)(&info[1].field_0x2 + bVar1));
          if (iVar3 == 0) {
            if (val_01 != (undefined8 *)0x0) goto LAB_00165448;
          }
          else {
            local_f4 = uVar8;
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s shm check failed\n",(char *)0x0,local_110,pMVar5);
            _mpp_log_l(2,"kmpp_obj","val     %p - %#llx:%#llx\n",(char *)0x0,val_01,*val_01,
                       val_01[1]);
            uVar8 = local_f4;
            _mpp_log_l(2,"kmpp_obj","val_chk %p - %#llx:%#llx\n",(char *)0x0,val_00,*val_00,
                       val_00[1]);
LAB_00165448:
            mpp_osal_free("kmpp_obj_udump_f",val_01);
          }
          obj = local_e8;
          pMVar5 = local_100;
          local_110 = (ulong)uVar8;
          if (val_00 != (undefined8 *)0x0) {
            mpp_osal_free("kmpp_obj_udump_f",val_00);
            local_110 = (ulong)uVar8;
          }
          goto LAB_00165044;
        case 0xd:
          local_114 = kmpp_obj_tbl_get_ptr(obj,pKVar7,(void **)&val);
          if (local_114 == 0) {
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s ptr %p\n",(char *)0x0,local_110,__haystack,
                       CONCAT44(uStack_b4,val));
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s ptr get failed\n",(char *)0x0,local_110,__haystack
                      );
          }
          kmpp_obj_get_ptr(obj,(char *)__haystack,(void **)&val_chk);
          if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_104,val_chk)) {
            pcVar6 = "%-2d - %-16s ptr check failed\n";
            goto LAB_001656be;
          }
          break;
        case 0xe:
          local_114 = kmpp_obj_tbl_get_fp(obj,pKVar7,(void **)&val);
          if (local_114 == 0) {
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s fp  %p\n",(char *)0x0,local_110,__haystack,
                       CONCAT44(uStack_b4,val));
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s fp  get failed\n",(char *)0x0,local_110,__haystack
                      );
          }
          kmpp_obj_get_fp(obj,(char *)__haystack,(void **)&val_chk);
          if (CONCAT44(uStack_b4,val) != CONCAT44(uStack_104,val_chk)) {
            pcVar6 = "%-2d - %-16s fp  check failed\n";
            goto LAB_001656be;
          }
        }
        pMVar5 = local_100;
        local_110 = (ulong)uVar8;
      }
      goto LAB_00165044;
    }
    iVar3 = -(uint)(local_114 != 0);
  }
  return iVar3;
}

Assistant:

rk_s32 kmpp_obj_udump_f(KmppObj obj, const char *caller)
{
    KmppObjImpl *impl = (KmppObjImpl *)obj;
    KmppObjDefImpl *def = impl ? impl->def : NULL;
    MppTrie trie = NULL;
    MppTrieInfo *info = NULL;
    MppTrieInfo *next = NULL;
    const char *name = NULL;
    rk_s32 ret = rk_nok;
    RK_S32 i = 0;

    if (!impl || !def) {
        mpp_loge_f("invalid obj %p def %p\n", impl, def);
        return rk_nok;
    }

    trie = impl->trie;
    name = def->name;

    mpp_logi("dump obj %-12s - %p at %s:\n", name, impl, caller);

    next = mpp_trie_get_info_first(trie);
    while (next) {
        KmppEntry *e;
        rk_s32 idx;

        info = next;
        next = mpp_trie_get_info_next(trie, info);

        e = (KmppEntry *)mpp_trie_info_ctx(info);
        name = mpp_trie_info_name(info);

        if (strstr(name, "__"))
            continue;

        idx = i++;

        switch (e->tbl.elem_type) {
        case ELEM_TYPE_s32 : {
            rk_s32 val;
            rk_s32 val_chk;

            ret = kmpp_obj_tbl_get_s32(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s s32 %#x:%d\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s s32 get failed\n", idx, name);

            kmpp_obj_get_s32(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s s32 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_u32 : {
            rk_u32 val;
            rk_u32 val_chk;

            ret = kmpp_obj_tbl_get_u32(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s u32 %#x:%u\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s u32 get failed\n", idx, name);

            kmpp_obj_get_u32(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s u32 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_s64 : {
            rk_s64 val;
            rk_s64 val_chk;

            ret = kmpp_obj_tbl_get_s64(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s s64 %#llx:%lld\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s s64 get failed\n", idx, name);

            kmpp_obj_get_s64(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s s64 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_u64 : {
            rk_u64 val;
            rk_u64 val_chk;

            ret = kmpp_obj_tbl_get_u64(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s u64 %#llx:%llu\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s u64 get failed\n", idx, name);

            kmpp_obj_get_u64(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s u64 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_st : {
            void *val_chk = mpp_malloc_size(void, e->tbl.elem_size);
            void *val = mpp_malloc_size(void, e->tbl.elem_size);
            rk_s32 data_size = e->tbl.elem_size;
            char logs[128];

            ret = kmpp_obj_tbl_get_st(obj, e, val);
            if (!ret) {
                rk_s32 pos;
                rk_s32 j;

                mpp_logi("%-2d - %-16s st  %d:%d\n", idx, name, e->tbl.elem_offset, data_size);

                j = 0;
                for (; j < data_size / 4 - 8; j += 8) {
                    snprintf(logs, sizeof(logs) - 1, "   - %02x : %#08x %#08x %#08x %#08x %#08x %#08x %#08x %#08x", j,
                             ((RK_U32 *)val)[j + 0], ((RK_U32 *)val)[j + 1],
                             ((RK_U32 *)val)[j + 2], ((RK_U32 *)val)[j + 3],
                             ((RK_U32 *)val)[j + 4], ((RK_U32 *)val)[j + 5],
                             ((RK_U32 *)val)[j + 6], ((RK_U32 *)val)[j + 7]);

                    mpp_logi("%s\n", logs);
                }

                pos = snprintf(logs, sizeof(logs) - 1, "   - %02x :", j);
                for (; j < data_size / 4; j++)
                    pos += snprintf(logs + pos, sizeof(logs) - 1 - pos, " %#08x", ((RK_U32 *)val)[j]);

                mpp_logi("%s\n", logs);
            } else
                mpp_loge("%-2d - %-16s st  get failed\n", idx, name);

            kmpp_obj_get_st(obj, name, val_chk);
            if (memcmp(val, val_chk, e->tbl.elem_size)) {
                mpp_loge("%-2d - %-16s st  check failed\n", idx, name);
                mpp_loge("val     %p\n", val);
                mpp_loge("val_chk %p\n", val_chk);
            }

            MPP_FREE(val);
            MPP_FREE(val_chk);
        } break;
        case ELEM_TYPE_shm : {
            KmppShmPtr *val_chk = mpp_malloc_size(void, e->tbl.elem_size);
            KmppShmPtr *val = mpp_malloc_size(void, e->tbl.elem_size);

            ret = kmpp_obj_tbl_get_st(obj, e, val);
            if (!ret)
                mpp_logi("%-2d - %-16s shm u%#llx:k%#llx\n",
                         idx, name, val->uaddr, val->kaddr);
            else
                mpp_loge("%-2d - %-16s shm get failed\n", idx, name);

            kmpp_obj_get_st(obj, name, val_chk);
            if (memcmp(val, val_chk, e->tbl.elem_size)) {
                mpp_loge("%-2d - %-16s shm check failed\n", idx, name);
                mpp_loge("val     %p - %#llx:%#llx\n", val, val->uaddr, val->kaddr);
                mpp_loge("val_chk %p - %#llx:%#llx\n", val_chk, val_chk->uaddr, val_chk->kaddr);
            }

            MPP_FREE(val);
            MPP_FREE(val_chk);
        } break;
        case ELEM_TYPE_uptr : {
            void *val;
            void *val_chk;

            ret = kmpp_obj_tbl_get_ptr(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s ptr %p\n", idx, name, val);
            else
                mpp_loge("%-2d - %-16s ptr get failed\n", idx, name);

            kmpp_obj_get_ptr(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s ptr check failed\n", idx, name);
        } break;
        case ELEM_TYPE_ufp : {
            void *val;
            void *val_chk;

            ret = kmpp_obj_tbl_get_fp(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s fp  %p\n", idx, name, val);
            else
                mpp_loge("%-2d - %-16s fp  get failed\n", idx, name);

            kmpp_obj_get_fp(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s fp  check failed\n", idx, name);
        } break;
        default : {
            mpp_loge("%-2d - %-16s found invalid type %d\n", idx, name, e->tbl.elem_type);
            ret = rk_nok;
        } break;
        }
    }

    return ret ? rk_nok : rk_ok;
}